

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button,float lock_threshold)

{
  bool bVar1;
  uint in_EDI;
  float in_XMM0_Da;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffd8;
  bool local_19;
  ImVec2 local_8;
  
  local_19 = 4 < in_EDI;
  if (local_19) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*g.IO.MouseDown)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x11dd,"ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton, float)");
  }
  if (in_XMM0_Da < 0.0) {
    in_XMM0_Da = (GImGui->IO).MouseDragThreshold;
  }
  if ((((((GImGui->IO).MouseDown[(int)in_EDI] & 1U) == 0) &&
       (((GImGui->IO).MouseReleased[(int)in_EDI] & 1U) == 0)) ||
      ((GImGui->IO).MouseDragMaxDistanceSqr[(int)in_EDI] < in_XMM0_Da * in_XMM0_Da)) ||
     ((bVar1 = IsMousePosValid((ImVec2 *)CONCAT44(in_EDI,in_XMM0_Da)), !bVar1 ||
      (bVar1 = IsMousePosValid((ImVec2 *)CONCAT44(in_EDI,in_XMM0_Da)), !bVar1)))) {
    ImVec2::ImVec2(&local_8,0.0,0.0);
  }
  else {
    local_8 = ::operator-(in_stack_ffffffffffffffd8,(ImVec2 *)0x1c2cdb);
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    if (g.IO.MouseDown[button] || g.IO.MouseReleased[button])
        if (g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold)
            if (IsMousePosValid(&g.IO.MousePos) && IsMousePosValid(&g.IO.MouseClickedPos[button]))
                return g.IO.MousePos - g.IO.MouseClickedPos[button];
    return ImVec2(0.0f, 0.0f);
}